

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_to_svg.hpp
# Opt level: O3

string * __thiscall font2svg::glyph::outline_abi_cxx11_(string *__return_storage_ptr__,glyph *this)

{
  pointer __dest;
  undefined8 uVar1;
  vector<short,_std::allocator<short>_> *in_R8;
  size_t __n;
  ulong uVar2;
  void *unaff_R15;
  vector<char,_std::allocator<char>_> tagsv;
  vector<short,_std::allocator<short>_> contoursv;
  vector<FT_Vector_,_std::allocator<FT_Vector_>_> pointsv;
  allocator_type local_b1;
  void *local_b0;
  void *local_a8;
  long local_a0;
  vector<short,_std::allocator<short>_> local_98;
  vector<char,_std::allocator<char>_> local_80;
  vector<FT_Vector_,_std::allocator<FT_Vector_>_> local_68;
  vector<FT_Vector_,_std::allocator<FT_Vector_>_> local_50;
  vector<FT_Vector_,_std::allocator<FT_Vector_>_> local_38;
  
  std::vector<FT_Vector_,std::allocator<FT_Vector_>>::vector<FT_Vector_*,void>
            ((vector<FT_Vector_,std::allocator<FT_Vector_>> *)&local_50,this->ftpoints,
             this->ftpoints + (this->ftoutline).n_points,(allocator_type *)&local_b0);
  std::vector<char,std::allocator<char>>::vector<char*,void>
            ((vector<char,std::allocator<char>> *)&local_b0,this->tags,
             this->tags + (this->ftoutline).n_points,(allocator_type *)&local_98);
  std::vector<short,std::allocator<short>>::vector<short*,void>
            ((vector<short,std::allocator<short>> *)&local_98,this->contours,
             this->contours + (this->ftoutline).n_contours,&local_b1);
  std::vector<FT_Vector_,_std::allocator<FT_Vector_>_>::vector(&local_68,&local_50);
  uVar2 = (long)local_a8 - (long)local_b0;
  if (uVar2 == 0) {
    __dest = (pointer)0x0;
    __n = 0;
  }
  else {
    if ((long)uVar2 < 0) {
      uVar1 = std::__throw_bad_alloc();
      if (local_80.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_80.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_80.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_80.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (unaff_R15 != (void *)0x0) {
        operator_delete(unaff_R15,uVar2);
      }
      if (local_68.super__Vector_base<FT_Vector_,_std::allocator<FT_Vector_>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.super__Vector_base<FT_Vector_,_std::allocator<FT_Vector_>_>._M_impl
                        .super__Vector_impl_data._M_start,
                        (long)local_68.super__Vector_base<FT_Vector_,_std::allocator<FT_Vector_>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.super__Vector_base<FT_Vector_,_std::allocator<FT_Vector_>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_98.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_98.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_98.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_b0 != (void *)0x0) {
        operator_delete(local_b0,local_a0 - (long)local_b0);
      }
      if (local_50.super__Vector_base<FT_Vector_,_std::allocator<FT_Vector_>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.super__Vector_base<FT_Vector_,_std::allocator<FT_Vector_>_>._M_impl
                        .super__Vector_impl_data._M_start,
                        (long)local_50.super__Vector_base<FT_Vector_,_std::allocator<FT_Vector_>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_50.super__Vector_base<FT_Vector_,_std::allocator<FT_Vector_>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      _Unwind_Resume(uVar1);
    }
    __dest = (pointer)operator_new(uVar2);
    __n = (long)local_a8 - (long)local_b0;
  }
  local_38.super__Vector_base<FT_Vector_,_std::allocator<FT_Vector_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)((long)__dest + uVar2);
  local_38.super__Vector_base<FT_Vector_,_std::allocator<FT_Vector_>_>._M_impl.
  super__Vector_impl_data._M_start = __dest;
  if (local_a8 != local_b0) {
    memmove(__dest,local_b0,__n);
  }
  local_38.super__Vector_base<FT_Vector_,_std::allocator<FT_Vector_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)((long)&__dest->x + __n);
  std::vector<short,_std::allocator<short>_>::vector
            ((vector<short,_std::allocator<short>_> *)&local_80,&local_98);
  do_outline_abi_cxx11_(__return_storage_ptr__,(font2svg *)&local_68,&local_38,&local_80,in_R8);
  if (local_80.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (__dest != (pointer)0x0) {
    operator_delete(__dest,uVar2);
  }
  if (local_68.super__Vector_base<FT_Vector_,_std::allocator<FT_Vector_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<FT_Vector_,_std::allocator<FT_Vector_>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<FT_Vector_,_std::allocator<FT_Vector_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<FT_Vector_,_std::allocator<FT_Vector_>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b0 != (void *)0x0) {
    operator_delete(local_b0,local_a0 - (long)local_b0);
  }
  if (local_50.super__Vector_base<FT_Vector_,_std::allocator<FT_Vector_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<FT_Vector_,_std::allocator<FT_Vector_>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<FT_Vector_,_std::allocator<FT_Vector_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<FT_Vector_,_std::allocator<FT_Vector_>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string outline()  {
		std::vector<FT_Vector> pointsv(ftpoints,ftpoints+ftoutline.n_points);
		std::vector<char> tagsv(tags,tags+ftoutline.n_points);
		std::vector<short> contoursv(contours,contours+ftoutline.n_contours);
		return do_outline(pointsv, tagsv, contoursv);
	}